

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall
Clasp::mt::LocalDistribution::LocalDistribution
          (LocalDistribution *this,Policy *p,uint32 maxT,uint32 topo)

{
  _func_int **pp_Var1;
  MPSCPtrQueue *this_00;
  Topology in_ECX;
  uint in_EDX;
  Policy *in_RSI;
  Distributor *in_RDI;
  ThreadData *ti;
  uint32 i;
  size_t sz;
  Topology t;
  size_t in_stack_ffffffffffffff98;
  __pointer_type in_stack_ffffffffffffffa0;
  uint local_34;
  uint32 in_stack_ffffffffffffffe4;
  
  Distributor::Distributor(in_RDI,in_RSI);
  in_RDI->_vptr_Distributor = (_func_int **)&PTR__LocalDistribution_002df370;
  in_RDI[1]._vptr_Distributor = (_func_int **)0x0;
  Detail::RawStack::RawStack((RawStack *)0x21fc5a);
  *(undefined4 *)&in_RDI[2]._vptr_Distributor = 0;
  *(uint *)&in_RDI[2]._vptr_Distributor = in_EDX;
  pp_Var1 = (_func_int **)operator_new__((ulong)in_EDX << 3);
  in_RDI[1]._vptr_Distributor = pp_Var1;
  for (local_34 = 0; local_34 != in_EDX; local_34 = local_34 + 1) {
    this_00 = (MPSCPtrQueue *)
              alignedAllocChecked((size_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ThreadData::ThreadData((ThreadData *)0x21fcd8);
    MPSCPtrQueue::init(this_00,(EVP_PKEY_CTX *)this_00[1].pad_);
    in_stack_ffffffffffffffa0 =
         (__pointer_type)ParallelSolveOptions::initPeerMask(in_EDX,in_ECX,in_stack_ffffffffffffffe4)
    ;
    this_00[1].head_._M_b._M_p = in_stack_ffffffffffffffa0;
    this_00[1].pad_[0x10] = '\0';
    this_00[1].pad_[0x11] = '\0';
    this_00[1].pad_[0x12] = '\0';
    this_00[1].pad_[0x13] = '\0';
    this_00[1].pad_[0x14] = '\0';
    this_00[1].pad_[0x15] = '\0';
    this_00[1].pad_[0x16] = '\0';
    this_00[1].pad_[0x17] = '\0';
    in_RDI[1]._vptr_Distributor[local_34] = (_func_int *)this_00;
  }
  return;
}

Assistant:

LocalDistribution::LocalDistribution(const Policy& p, uint32 maxT, uint32 topo) : Distributor(p), thread_(0), numThread_(0) {
	typedef ParallelSolveOptions::Integration::Topology Topology;
	assert(maxT <= ParallelSolveOptions::supportedSolvers());
	Topology t = static_cast<Topology>(topo);
	thread_    = new ThreadData*[numThread_ = maxT];
	size_t sz  = ((sizeof(ThreadData) + 63) / 64) * 64;
	for (uint32 i = 0; i != maxT; ++i) {
		ThreadData* ti = new (alignedAllocChecked(sz)) ThreadData;
		ti->received.init(&ti->sentinel);
		ti->peers = ParallelSolveOptions::initPeerMask(i, t, maxT);
		ti->free  = 0;
		thread_[i]= ti;
	}
}